

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O3

SUNLinearSolver SUNLinSol_Dense(N_Vector y,SUNMatrix A,SUNContext_conflict sunctx)

{
  SUNLinearSolver_Ops p_Var1;
  sunindextype sVar2;
  SUNLinearSolver p_Var3;
  sunindextype *psVar4;
  void *pvVar5;
  
  sVar2 = SUNDenseMatrix_Rows(A);
  p_Var3 = (SUNLinearSolver)SUNLinSolNewEmpty(sunctx);
  p_Var1 = p_Var3->ops;
  p_Var1->gettype = SUNLinSolGetType_Dense;
  p_Var1->getid = SUNLinSolGetID_Dense;
  p_Var1->initialize = SUNLinSolInitialize_Dense;
  p_Var1->setup = SUNLinSolSetup_Dense;
  p_Var1->solve = SUNLinSolSolve_Dense;
  p_Var1->lastflag = SUNLinSolLastFlag_Dense;
  p_Var1->space = SUNLinSolSpace_Dense;
  p_Var1->free = SUNLinSolFree_Dense;
  psVar4 = (sunindextype *)malloc(0x18);
  p_Var3->content = psVar4;
  *psVar4 = sVar2;
  pvVar5 = malloc(sVar2 << 3);
  psVar4[2] = 0;
  psVar4[1] = (sunindextype)pvVar5;
  return p_Var3;
}

Assistant:

SUNLinearSolver SUNLinSol_Dense(SUNDIALS_MAYBE_UNUSED N_Vector y, SUNMatrix A,
                                SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNLinearSolver S;
  SUNLinearSolverContent_Dense content;
  sunindextype MatrixRows;

  SUNAssertNull(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssertNull(SUNDenseMatrix_Rows(A) == SUNDenseMatrix_Columns(A),
                SUN_ERR_ARG_DIMSMISMATCH);
  SUNAssertNull(y->ops->nvgetarraypointer, SUN_ERR_ARG_INCOMPATIBLE);

  MatrixRows = SUNDenseMatrix_Rows(A);
  SUNAssertNull(MatrixRows == N_VGetLength(y), SUN_ERR_ARG_DIMSMISMATCH);

  /* Create an empty linear solver */
  S = NULL;
  S = SUNLinSolNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  S->ops->gettype    = SUNLinSolGetType_Dense;
  S->ops->getid      = SUNLinSolGetID_Dense;
  S->ops->initialize = SUNLinSolInitialize_Dense;
  S->ops->setup      = SUNLinSolSetup_Dense;
  S->ops->solve      = SUNLinSolSolve_Dense;
  S->ops->lastflag   = SUNLinSolLastFlag_Dense;
  S->ops->space      = SUNLinSolSpace_Dense;
  S->ops->free       = SUNLinSolFree_Dense;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_Dense)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  S->content = content;

  /* Fill content */
  content->N         = MatrixRows;
  content->last_flag = 0;
  content->pivots    = NULL;

  /* Allocate content */
  content->pivots = (sunindextype*)malloc(MatrixRows * sizeof(sunindextype));
  SUNAssertNull(content->pivots, SUN_ERR_MALLOC_FAIL);

  return (S);
}